

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_list.c
# Opt level: O0

uint32_t * prf_vertex_list_get_list_ptr(prf_node_t *node)

{
  ushort *in_RDI;
  uint32_t *local_8;
  
  if (*in_RDI == prf_vertex_list_info.opcode) {
    local_8 = *(uint32_t **)(in_RDI + 4);
  }
  else {
    prf_error(9,"tried vertex_list_get_list_ptr() on node of type %d.",(ulong)*in_RDI);
    local_8 = (uint32_t *)0x0;
  }
  return local_8;
}

Assistant:

uint32_t *
prf_vertex_list_get_list_ptr(
    prf_node_t * node )
{
    assert( node != NULL );

    if ( node->opcode != prf_vertex_list_info.opcode ) {
        prf_error( 9, "tried vertex_list_get_list_ptr() on node of type %d.",
            node->opcode );
        return NULL;
    }

    return (uint32_t *) node->data;
}